

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O2

XmlNodePtr __thiscall libcellml::XmlDoc::rootNode(XmlDoc *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *in_RSI;
  undefined1 auVar2 [16];
  XmlNodePtr XVar3;
  xmlNodePtr root;
  xmlNodePtr local_28;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  auVar2 = xmlDocGetRootElement(*(undefined8 *)*in_RSI);
  _Var1._M_pi = auVar2._8_8_;
  local_28 = auVar2._0_8_;
  this->mPimpl = (XmlDocImpl *)0x0;
  this[1].mPimpl = (XmlDocImpl *)0x0;
  if (local_28 != (xmlNodePtr)0x0) {
    std::make_shared<libcellml::XmlNode>();
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    XmlNode::setXmlNode((XmlNode *)this->mPimpl,&local_28);
    _Var1._M_pi = extraout_RDX;
  }
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlDoc::rootNode() const
{
    xmlNodePtr root = xmlDocGetRootElement(mPimpl->mXmlDocPtr);
    XmlNodePtr rootHandle = nullptr;
    if (root != nullptr) {
        rootHandle = std::make_shared<XmlNode>();
        rootHandle->setXmlNode(root);
    }
    return rootHandle;
}